

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miscn.c
# Opt level: O0

int OP_miscn(int misc_index,int arg_count)

{
  LispPTR *pLVar1;
  uint local_2c;
  int local_28;
  int user_subr;
  int arg_num;
  int result;
  LispPTR *stk;
  int arg_count_local;
  int misc_index_local;
  
  OP_miscn::args[0] = 0;
  _arg_num = (LispPTR *)(MachineState.csp + 2);
  if (0 < arg_count) {
    pLVar1 = (LispPTR *)(MachineState.csp + 4);
    *_arg_num = MachineState.tosvalue;
    local_28 = arg_count;
    _arg_num = pLVar1;
    while (0 < local_28) {
      local_28 = local_28 + -1;
      OP_miscn::args[local_28] = _arg_num[-1];
      _arg_num = _arg_num + -1;
    }
  }
  switch(misc_index) {
  case 0:
    if ((OP_miscn::args[0] & 0xfff0000) == 0xe0000) {
      local_2c = OP_miscn::args[0] & 0xffff;
    }
    else if ((OP_miscn::args[0] & 0xfff0000) == 0xf0000) {
      local_2c = OP_miscn::args[0] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (OP_miscn::args[0] >> 9)) ^ 2) & 0x7ff) != 2)
      goto LAB_0015184d;
      pLVar1 = NativeAligned4FromLAddr(OP_miscn::args[0]);
      local_2c = *pLVar1;
    }
    user_subr = UserSubr(local_2c,arg_count + -1,OP_miscn::args + 1);
    if (-1 < user_subr) goto LAB_0015180a;
    goto LAB_0015184d;
  case 1:
    if (arg_count < 0x100) {
      user_subr = values(arg_count,OP_miscn::args);
      goto LAB_0015180a;
    }
    error("miscn: arg_count too big! continue punts");
    goto LAB_0015184d;
  case 2:
    user_subr = SX_hash(OP_miscn::args[0]);
    goto LAB_0015180a;
  default:
    goto LAB_0015184d;
  case 4:
    user_subr = STRING_HASHBITS(OP_miscn::args[0]);
    goto LAB_0015180a;
  case 5:
    user_subr = STRING_EQUAL_HASHBITS(OP_miscn::args[0]);
    goto LAB_0015180a;
  case 6:
    if (arg_count < 0x100) {
      user_subr = values_list(arg_count,OP_miscn::args);
      goto LAB_0015180a;
    }
    error("miscn: arg_count too big! continue punts");
    goto LAB_0015184d;
  case 7:
    user_subr = LCFetchMethod(OP_miscn::args[0],OP_miscn::args[1]);
    break;
  case 8:
    user_subr = LCFetchMethodOrHelp(OP_miscn::args[0],OP_miscn::args[1]);
    break;
  case 9:
    user_subr = LCFindVarIndex(OP_miscn::args[0],OP_miscn::args[1]);
    break;
  case 10:
    user_subr = LCGetIVValue(OP_miscn::args[0],OP_miscn::args[1]);
    break;
  case 0xb:
    user_subr = LCPutIVValue(OP_miscn::args[0],OP_miscn::args[1],OP_miscn::args[2]);
    break;
  case 0xc:
    user_subr = 0;
    goto LAB_0015180a;
  }
  if (user_subr < 0) {
    if (user_subr == 0xfffffffe) {
      arg_count_local = 0;
    }
    else {
LAB_0015184d:
      arg_count_local = 1;
    }
  }
  else {
LAB_0015180a:
    MachineState.currentpc = MachineState.currentpc + 3;
    MachineState.csp = (DLword *)(_arg_num + -1);
    MachineState.tosvalue = user_subr;
    arg_count_local = 0;
  }
  return arg_count_local;
}

Assistant:

int OP_miscn(int misc_index, int arg_count) {
  LispPTR *stk;
  int result;
  static LispPTR args[255];

  /* Put the Args into a Vector */

  args[0] = NIL_PTR;
  stk = ((LispPTR *)(void *)CurrentStackPTR) + 1;

  {
    int arg_num = arg_count;
    if (arg_num > 0) {
      *stk++ = (LispPTR)TopOfStack;
      while (arg_num > 0) args[--arg_num] = *--stk;
    }
  }

  /* Select the Misc Number */

  switch (misc_index) {
    case miscn_USER_SUBR: {
      int user_subr;
      N_GETNUMBER(args[0], user_subr, do_ufn);
      if ((result = UserSubr(user_subr, arg_count - 1, &args[1])) < 0) goto do_ufn;
    } break;
    case miscn_SXHASH: result = SX_hash(args[0]); break;

    case miscn_STRING_EQUAL_HASHBITS: result = STRING_EQUAL_HASHBITS(args[0]); break;

    case miscn_STRINGHASHBITS: result = STRING_HASHBITS(args[0]); break;

    case miscn_VALUES:
      if (arg_count > 255) {
        error("miscn: arg_count too big! continue punts");
        goto do_ufn;
      }
      result = values(arg_count, args);
      break;

    case miscn_VALUES_LIST:
      /*** debugging: should be impossible, but ADB found this once -FS *****/
      if (arg_count > 255) {
        error("miscn: arg_count too big! continue punts");
        goto do_ufn;
      }
      result = values_list(arg_count, args);
      break;

    case miscn_LCFetchMethod:
      result = LCFetchMethod(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCFetchMethodOrHelp:
      result = LCFetchMethodOrHelp(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCFindVarIndex:
      result = LCFindVarIndex(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCGetIVValue:
      result = LCGetIVValue(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCPutIVValue:
      result = LCPutIVValue(args[0], args[1], args[2]);
      if (result < 0) goto lc_ufn;
      break;
#ifdef RS232
    case miscn_RAW_RS232C_OPEN:
      if ((result = raw_rs232c_open(args[0])) == NIL) goto do_ufn;

      break;

    case miscn_RAW_RS232C_CLOSE:
      if ((result = raw_rs232c_close(args[0])) == NIL) goto do_ufn;

      break;

    case miscn_RAW_RS232C_SETPARAM:
      if ((result = raw_rs232c_setparams(args[0], args[1])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_GETPARAM:
      /******/ break;
    case miscn_RAW_RS232C_READ:
      if ((result = raw_rs232c_read(args[0], args[1], args[2])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_WRITE:
      if ((result = raw_rs232c_write(args[0], args[1], args[2])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_SETINT:
      if ((result = raw_rs232c_setint(args[0], args[1])) == NIL) goto do_ufn;
      break;
    case miscn_CHATTER: result = chatter(args); break;
#endif /* RS232 */

#ifdef JLISP
    case miscn_EJLISP:
#ifndef NOWNN
      result = ejlisp(args);
#endif
      break;
#endif /* JLISP */

    case /* miscn_CALL_C*/ 014:
      /* result = call_c_fn(args); */
      result = 0;
    break;

    default: goto do_ufn;

  } /* switch end */

  /* Setup Global Machine State for a Normal Return */

  PC += 3;
  CurrentStackPTR = (DLword *)(stk - 1);
  TopOfStack = (LispPTR)result;
  return (0);

/* A UFN request, so return 1 & don't change the Machine State */

do_ufn:
  return (1);
lc_ufn:
  if (result == -2) {
    return (0); /* have built new stack frame */
  } else {
    goto do_ufn;
  }

}